

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int apply_ac(OBJ_DATA *obj,int iWear,int type)

{
  int iVar1;
  
  iVar1 = 0;
  if (obj->item_type == 9) {
    iVar1 = 0;
    switch(iWear) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x11:
    case 0x14:
      iVar1 = obj->value[type];
      break;
    case 5:
      return obj->value[type] * 3;
    case 0xc:
      return obj->value[type] * 2;
    }
  }
  return iVar1;
}

Assistant:

int apply_ac(OBJ_DATA *obj, int iWear, int type)
{
	if (obj->item_type != ITEM_ARMOR)
		return 0;

	switch (iWear)
	{
		case WEAR_STRAPPED:
			return obj->value[type];
		case WEAR_BODY:
			return 3 * obj->value[type];
		case WEAR_HEAD:
			return obj->value[type];
		case WEAR_LEGS:
			return obj->value[type];
		case WEAR_FEET:
			return obj->value[type];
		case WEAR_HANDS:
			return obj->value[type];
		case WEAR_ARMS:
			return obj->value[type];
		case WEAR_SHIELD:
			return obj->value[type];
		case WEAR_NECK_1:
			return obj->value[type];
		case WEAR_NECK_2:
			return obj->value[type];
		case WEAR_ABOUT:
			return 2 * obj->value[type];
		case WEAR_WAIST:
			return obj->value[type];
		case WEAR_WRIST_L:
			return obj->value[type];
		case WEAR_WRIST_R:
			return obj->value[type];
		case WEAR_HOLD:
			return obj->value[type];
		case WEAR_FINGER_L:
			return obj->value[type];
		case WEAR_FINGER_R:
			return obj->value[type];
	}

	return 0;
}